

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O1

void __thiscall xLearn::DMatrix::Reset(DMatrix *this)

{
  pointer pfVar1;
  pointer ppvVar2;
  ulong uVar3;
  
  this->has_label = true;
  this->hash_value_1 = 0;
  this->hash_value_2 = 0;
  pfVar1 = (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  if (this->row_length != 0) {
    uVar3 = 0;
    do {
      if ((this->row).
          super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3] !=
          (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0) {
        STLDeleteElementsAndClear<std::vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>>
                  (&this->row);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->row_length);
  }
  ppvVar2 = (this->row).
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->row).
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row).
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row).
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppvVar2 != (pointer)0x0) {
    operator_delete(ppvVar2);
  }
  pfVar1 = (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  this->row_length = 0;
  this->pos = 0;
  return;
}

Assistant:

void Reset() {
    this->has_label = true;
    this->hash_value_1 = 0;
    this->hash_value_2 = 0;
    // Delete Y
    std::vector<real_t>().swap(this->Y);
    // Delete Node
    for (int i = 0; i < this->row_length; ++i) {
      if ((this->row)[i] != nullptr) {
        STLDeleteElementsAndClear(&(this->row));
      }
    }
    // Delete SparseRow
    std::vector<SparseRow*>().swap(this->row);
    // Delete norm
    std::vector<real_t>().swap(this->norm);
    this->row_length = 0;
    this->pos = 0;
  }